

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O2

UserSet * __thiscall wasm::DataFlow::Users::getUsers(Users *this,Node *node)

{
  int iVar1;
  iterator iVar2;
  UserSet *pUVar3;
  Node *local_18;
  Node *node_local;
  
  local_18 = node;
  iVar2 = std::
          _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_18);
  if (iVar2.
      super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pUVar3 = &getUsers::empty;
    if (getUsers(wasm::DataFlow::Node*)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&getUsers(wasm::DataFlow::Node*)::empty);
      if (iVar1 != 0) {
        pUVar3 = &getUsers::empty;
        getUsers::empty._M_h._M_buckets = &getUsers::empty._M_h._M_single_bucket;
        getUsers::empty._M_h._M_bucket_count = 1;
        getUsers::empty._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        getUsers::empty._M_h._M_element_count = 0;
        getUsers::empty._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        getUsers::empty._M_h._M_rehash_policy._M_next_resize = 0;
        getUsers::empty._M_h._M_single_bucket = (__node_base_ptr)0x0;
        __cxa_atexit(std::
                     unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                     ::~unordered_set,&getUsers::empty,&__dso_handle);
        __cxa_guard_release(&getUsers(wasm::DataFlow::Node*)::empty);
      }
    }
  }
  else {
    pUVar3 = (UserSet *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false>
                    ._M_cur + 0x10);
  }
  return pUVar3;
}

Assistant:

UserSet& getUsers(Node* node) {
    auto iter = users.find(node);
    if (iter == users.end()) {
      static UserSet empty; // FIXME thread_local?
      return empty;
    }
    return iter->second;
  }